

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O2

void __thiscall NaPNKalman::NaPNKalman(NaPNKalman *this,char *szNodeName)

{
  NaPetriNode::NaPetriNode(&this->super_NaPetriNode,szNodeName);
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNKalman_001756d0;
  NaPetriCnInput::NaPetriCnInput(&this->u,&this->super_NaPetriNode,"u");
  NaPetriCnInput::NaPetriCnInput(&this->v,&this->super_NaPetriNode,"v");
  NaPetriCnInput::NaPetriCnInput(&this->w,&this->super_NaPetriNode,"w");
  NaPetriCnOutput::NaPetriCnOutput(&this->y_obs,&this->super_NaPetriNode,"y_obs");
  NaPetriCnOutput::NaPetriCnOutput(&this->x_int,&this->super_NaPetriNode,"x_int");
  NaPetriCnOutput::NaPetriCnOutput(&this->x_est,&this->super_NaPetriNode,"x_est");
  NaMatrix::NaMatrix(&this->A,0,0);
  NaMatrix::NaMatrix(&this->B,0,0);
  NaMatrix::NaMatrix(&this->C,0,0);
  NaMatrix::NaMatrix(&this->Q,0,0);
  NaMatrix::NaMatrix(&this->R,0,0);
  NaVector::NaVector(&this->x,0);
  NaVector::NaVector(&this->x0,0);
  NaVector::NaVector(&this->x_extra,0);
  NaMatrix::NaMatrix(&this->Px0,0,0);
  NaMatrix::NaMatrix(&this->P_extra,0,0);
  NaMatrix::NaMatrix(&this->P_tilde,0,0);
  NaMatrix::NaMatrix(&this->K,0,0);
  return;
}

Assistant:

NaPNKalman::NaPNKalman (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  u(this, "u"),
  v(this, "v"),
  w(this, "w"),
  y_obs(this, "y_obs"),
  x_est(this, "x_est"),
  x_int(this, "x_int")
{
    // Nothing to do
}